

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring_unittest.cc
# Opt level: O0

void __thiscall google::protobuf::SingleArena_GetSet_Test::TestBody(SingleArena_GetSet_Test *this)

{
  bool bVar1;
  string *psVar2;
  char *pcVar3;
  pointer pAVar4;
  AssertHelper local_90;
  Message local_88;
  undefined1 local_80 [8];
  AssertionResult gtest_ar_2;
  Message local_68;
  undefined1 local_60 [8];
  AssertionResult gtest_ar_1;
  Message local_48;
  undefined1 local_40 [8];
  AssertionResult gtest_ar;
  ArenaStringPtr local_20;
  ArenaStringPtr field;
  unique_ptr<google::protobuf::Arena,_std::default_delete<google::protobuf::Arena>_> arena;
  SingleArena_GetSet_Test *this_local;
  
  SingleArena::GetArena((SingleArena *)&field);
  internal::ArenaStringPtr::InitDefault(&local_20);
  psVar2 = internal::ArenaStringPtr::Get_abi_cxx11_(&local_20);
  testing::internal::EqHelper::
  Compare<char[1],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_40,"\"\"","field.Get()",(char (*) [1])(anon_var_dwarf_37cdd0 + 5),
             psVar2);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_40);
  if (!bVar1) {
    testing::Message::Message(&local_48);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_40);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arenastring_unittest.cc"
               ,0x38,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_48);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_40);
  pAVar4 = std::unique_ptr<google::protobuf::Arena,_std::default_delete<google::protobuf::Arena>_>::
           get((unique_ptr<google::protobuf::Arena,_std::default_delete<google::protobuf::Arena>_> *
               )&field);
  internal::ArenaStringPtr::Set(&local_20,"Test short",pAVar4);
  psVar2 = internal::ArenaStringPtr::Get_abi_cxx11_(&local_20);
  testing::internal::EqHelper::
  Compare<char[11],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_60,"\"Test short\"","field.Get()",(char (*) [11])"Test short",psVar2)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_60);
  if (!bVar1) {
    testing::Message::Message(&local_68);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_60);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arenastring_unittest.cc"
               ,0x3a,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_68);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_60);
  pAVar4 = std::unique_ptr<google::protobuf::Arena,_std::default_delete<google::protobuf::Arena>_>::
           get((unique_ptr<google::protobuf::Arena,_std::default_delete<google::protobuf::Arena>_> *
               )&field);
  internal::ArenaStringPtr::Set(&local_20,"Test long long long long value",pAVar4);
  psVar2 = internal::ArenaStringPtr::Get_abi_cxx11_(&local_20);
  testing::internal::EqHelper::
  Compare<char[31],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_80,"\"Test long long long long value\"","field.Get()",
             (char (*) [31])"Test long long long long value",psVar2);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_80);
  if (!bVar1) {
    testing::Message::Message(&local_88);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_80);
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arenastring_unittest.cc"
               ,0x3c,pcVar3);
    testing::internal::AssertHelper::operator=(&local_90,&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    testing::Message::~Message(&local_88);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_80);
  pAVar4 = std::unique_ptr<google::protobuf::Arena,_std::default_delete<google::protobuf::Arena>_>::
           get((unique_ptr<google::protobuf::Arena,_std::default_delete<google::protobuf::Arena>_> *
               )&field);
  internal::ArenaStringPtr::Set(&local_20,anon_var_dwarf_37cdd0 + 5,pAVar4);
  internal::ArenaStringPtr::Destroy(&local_20);
  std::unique_ptr<google::protobuf::Arena,_std::default_delete<google::protobuf::Arena>_>::
  ~unique_ptr((unique_ptr<google::protobuf::Arena,_std::default_delete<google::protobuf::Arena>_> *)
              &field);
  return;
}

Assistant:

TEST_P(SingleArena, GetSet) {
  auto arena = GetArena();
  ArenaStringPtr field;
  field.InitDefault();
  EXPECT_EQ("", field.Get());
  field.Set("Test short", arena.get());
  EXPECT_EQ("Test short", field.Get());
  field.Set("Test long long long long value", arena.get());
  EXPECT_EQ("Test long long long long value", field.Get());
  field.Set("", arena.get());
  field.Destroy();
}